

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O3

bool __thiscall
testing::internal::
OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
::Matches(OnCallSpec<TestResult_(mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>)>
          *this,ArgumentTuple *args)

{
  char cVar1;
  undefined1 uVar2;
  
  cVar1 = (**(code **)(**(long **)(this + 0x18) + 0x20))
                    (*(long **)(this + 0x18),
                     (args->
                     super__Tuple_impl<0UL,_mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>_>
                     ).
                     super__Head_base<0UL,_mp::BasicBinaryExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)53,_(mp::expr::Kind)58>,_false>
                     ._M_head_impl.super_BasicExpr<(mp::expr::Kind)53,_(mp::expr::Kind)58>.
                     super_ExprBase.impl_);
  if (cVar1 == '\0') {
    uVar2 = 0;
  }
  else {
    uVar2 = (**(code **)(**(long **)(this + 0x30) + 0x20))(*(long **)(this + 0x30),args);
  }
  return (bool)uVar2;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }